

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_test.cpp
# Opt level: O2

void doTest(TestStartupParamsAndResults *startupParams)

{
  size_t sVar1;
  TestRes *pTVar2;
  long lVar3;
  long lVar4;
  thread *this;
  TestStartupParamsAndResults *pTVar5;
  ThreadStartupParamsAndResults *pTVar6;
  ThreadTestRes **ppTVar7;
  size_t i;
  unsigned_long uVar8;
  size_t sVar9;
  byte bVar10;
  ThreadStartupParamsAndResults *local_f48;
  thread t1;
  thread threads [32];
  ThreadStartupParamsAndResults testParams [32];
  
  bVar10 = 0;
  sVar1 = (startupParams->startupParams).threadCount;
  this = threads;
  memset(this,0,0x100);
  lVar4 = 0x3030;
  ppTVar7 = &testParams[0].threadResPerThreadAlloc;
  for (sVar9 = 0; sVar1 != sVar9; sVar9 = sVar9 + 1) {
    pTVar5 = startupParams;
    pTVar6 = (ThreadStartupParamsAndResults *)(ppTVar7 + -0xd);
    for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
      (pTVar6->startupParams).threadCount = (pTVar5->startupParams).threadCount;
      pTVar5 = (TestStartupParamsAndResults *)((long)pTVar5 + (ulong)bVar10 * -0x10 + 8);
      pTVar6 = (ThreadStartupParamsAndResults *)((long)pTVar6 + (ulong)bVar10 * -0x10 + 8);
    }
    ppTVar7[-3] = (ThreadTestRes *)sVar9;
    pTVar2 = startupParams->testRes;
    ppTVar7[-2] = (ThreadTestRes *)((long)pTVar2 + lVar4 + -0x3000);
    ppTVar7[-1] = (ThreadTestRes *)((long)pTVar2 + lVar4 + -0x1800);
    *ppTVar7 = (ThreadTestRes *)((long)pTVar2->threadResEmpty + lVar4 + -0x30);
    ppTVar7 = ppTVar7 + 0xe;
    lVar4 = lVar4 + 0xc0;
  }
  pTVar6 = testParams;
  for (uVar8 = 0; sVar1 != uVar8; uVar8 = uVar8 + 1) {
    nodecpp::log::default_log::info<char_const*,unsigned_long>("about to run thread {}...",uVar8);
    local_f48 = pTVar6;
    std::thread::thread<void*(&)(void*),void*,void>(&t1,runRandomTest,&local_f48);
    std::thread::operator=(this,&t1);
    nodecpp::log::default_log::info<char_const*>("    ...done");
    std::thread::~thread(&t1);
    pTVar6 = pTVar6 + 1;
    this = this + 1;
  }
  for (uVar8 = 0; sVar1 != uVar8; uVar8 = uVar8 + 1) {
    nodecpp::log::default_log::info<char_const*,unsigned_long>("joining thread {}...",uVar8);
    std::thread::join();
    nodecpp::log::default_log::info<char_const*>("    ...done");
  }
  lVar4 = 0xf8;
  do {
    std::thread::~thread((thread *)((long)&threads[0]._M_id._M_thread + lVar4));
    lVar4 = lVar4 + -8;
  } while (lVar4 != -8);
  return;
}

Assistant:

void doTest( TestStartupParamsAndResults* startupParams )
{
	size_t testThreadCount = startupParams->startupParams.threadCount;

	ThreadStartupParamsAndResults testParams[max_threads];
	std::thread threads[ max_threads ];

	for ( size_t i=0; i<testThreadCount; ++i )
	{
		memcpy( testParams + i, startupParams, sizeof(TestStartupParams) );
		testParams[i].threadID = i;
		testParams[i].threadResEmpty = startupParams->testRes->threadResEmpty + i;
		testParams[i].threadResNewDel = startupParams->testRes->threadResNewDel + i;
		testParams[i].threadResPerThreadAlloc = startupParams->testRes->threadResPerThreadAlloc + i;
	}

	// run thread
	for ( size_t i=0; i<testThreadCount; ++i )
	{
		nodecpp::log::default_log::info( "about to run thread {}...", i );
		std::thread t1( runRandomTest, (void*)(testParams + i) );
		threads[i] = std::move( t1 );
//		t1.detach();
		nodecpp::log::default_log::info( "    ...done" );
	}
	// join threads
	for ( size_t i=0; i<testThreadCount; ++i )
	{
		nodecpp::log::default_log::info( "joining thread {}...", i );
		threads[i].join();
		nodecpp::log::default_log::info( "    ...done" );
	}
}